

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O1

void __thiscall
fineftp::FtpSession::readDataFromFileAndSend
          (FtpSession *this,shared_ptr<fineftp::FtpSession::IoFile> *file,
          shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
          *data_socket)

{
  strand_service *psVar1;
  implementation_type psVar2;
  scheduler_operation *psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1208:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  *pcVar7;
  scheduler_operation *psVar8;
  template_rebind_alloc<completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1208:26),_basic_executor_type<allocator<void>,_0U>_>_>
  a;
  undefined8 uVar9;
  long *in_FS_OFFSET;
  anon_class_48_3_1f1b95e1_for_handler_ local_68;
  ptr local_38;
  
  ::std::__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fineftp::FtpSession,void>
            ((__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (__weak_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_68.file.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (file->super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68.file.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (file->super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_68.file.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.file.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_68.file.
            super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.file.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_68.file.
            super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_68.data_socket.
  super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (data_socket->
            super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_68.data_socket.
  super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (data_socket->
       super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  if (local_68.data_socket.
      super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.data_socket.
       super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_68.data_socket.
            super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.data_socket.
       super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_68.data_socket.
            super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  psVar1 = (this->file_rw_strand_).service_;
  if (*(long *)(*in_FS_OFFSET + -0x10) == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x10) + 8);
  }
  local_38.h = &local_68;
  pcVar7 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1208:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
            *)asio::detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                        (uVar9,0x50);
  _Var6._M_pi = local_68.data_socket.
                super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  _Var5._M_pi = local_68.file.
                super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  _Var4._M_pi = local_68.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  (pcVar7->super_operation).next_ = (scheduler_operation *)0x0;
  (pcVar7->super_operation).func_ =
       asio::detail::
       completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1208:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
       ::do_complete;
  (pcVar7->super_operation).task_result_ = 0;
  (pcVar7->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_68.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (pcVar7->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pcVar7->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  local_68.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pcVar7->handler_).file.
  super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_68.file.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (pcVar7->handler_).file.
  super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.file.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pcVar7->handler_).file.
  super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  local_68.file.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pcVar7->handler_).data_socket.
  super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_68.data_socket.
            super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  (pcVar7->handler_).data_socket.
  super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.data_socket.
  super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pcVar7->handler_).data_socket.
  super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var6._M_pi;
  local_68.data_socket.
  super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_38.v = pcVar7;
  local_38.p = pcVar7;
  pthread_mutex_lock((pthread_mutex_t *)&((this->file_rw_strand_).impl_)->mutex_);
  psVar2 = (this->file_rw_strand_).impl_;
  if (psVar2->locked_ == true) {
    (pcVar7->super_operation).next_ = (scheduler_operation *)0x0;
    psVar3 = (psVar2->waiting_queue_).back_;
    psVar8 = (scheduler_operation *)&(psVar2->waiting_queue_).back_;
    if (psVar3 != (scheduler_operation *)0x0) {
      psVar8 = psVar3;
    }
    psVar8->next_ = (scheduler_operation *)pcVar7;
    (&(psVar2->waiting_queue_).front_)[psVar3 != (scheduler_operation *)0x0] =
         (scheduler_operation *)pcVar7;
    pthread_mutex_unlock((pthread_mutex_t *)&((this->file_rw_strand_).impl_)->mutex_);
  }
  else {
    psVar2->locked_ = true;
    pthread_mutex_unlock((pthread_mutex_t *)&psVar2->mutex_);
    psVar2 = (this->file_rw_strand_).impl_;
    (pcVar7->super_operation).next_ = (scheduler_operation *)0x0;
    psVar3 = (psVar2->ready_queue_).back_;
    psVar8 = (scheduler_operation *)&(psVar2->ready_queue_).back_;
    if (psVar3 != (scheduler_operation *)0x0) {
      psVar8 = psVar3;
    }
    psVar8->next_ = (scheduler_operation *)pcVar7;
    (&(psVar2->ready_queue_).front_)[psVar3 != (scheduler_operation *)0x0] =
         (scheduler_operation *)pcVar7;
    asio::detail::scheduler::post_immediate_completion
              (psVar1->io_context_impl_,&((this->file_rw_strand_).impl_)->super_operation,false);
  }
  local_38.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1208:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)0x0;
  local_38.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1208:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)0x0;
  asio::detail::
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1208:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  ::ptr::reset(&local_38);
  if (local_68.data_socket.
      super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.data_socket.
               super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_68.file.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.file.
               super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_68.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void FtpSession::readDataFromFileAndSend(std::shared_ptr<IoFile> file, std::shared_ptr<asio::ip::tcp::socket> data_socket)
  {
    file_rw_strand_.post([me = shared_from_this(), file, data_socket]()
                        {
                          if(file->file_stream_.eof()) return;

                          std::shared_ptr<std::vector<char>>buffer = std::make_shared<std::vector<char>>(1024 * 1024 * 1);
                          file->file_stream_.read(buffer->data(), static_cast<std::streamsize>(buffer->size()));
                          auto bytes_read = file->file_stream_.gcount();
                          buffer->resize(static_cast<size_t>(bytes_read));

                          if (!file->file_stream_.eof())
                          {
                            me->addDataToBufferAndSend(buffer, data_socket, [me, file, data_socket]() {me->readDataFromFileAndSend(file, data_socket); });
                          }
                          else
                          {
                            me->addDataToBufferAndSend(buffer, data_socket);
                            me->addDataToBufferAndSend(std::shared_ptr<std::vector<char>>(nullptr), data_socket);
                          }
                        });
  }